

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O3

void GenCodeCmdBitXorl(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  x86Reg reg1;
  x86Reg reg2;
  
  reg1 = CodeGenGenericContext::GetReg(&ctx->ctx);
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,reg1,sQWORD,rEBX,(uint)((ulong)cmd >> 0xd) & 0x7f8);
  reg2 = GenCodeLoadInt64FromPointerIntoRegister(ctx,cmd.rC,cmd.argument);
  CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
            (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
  EMIT_OP_REG_REG(&ctx->ctx,o_xor64,reg1,reg2);
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBX,(uint)((ulong)cmd >> 5) & 0x7f8,reg1);
  return;
}

Assistant:

void GenCodeCmdBitXorl(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
#if defined(_M_X64)
	x86Reg lhsReg = ctx.ctx.GetReg();

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, lhsReg, sQWORD, rREG, cmd.rB * 8); // Load lhs

	x86Reg target = GenCodeLoadInt64FromPointerIntoRegister(ctx, cmd.rC, cmd.argument);

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	EMIT_OP_REG_REG(ctx.ctx, o_xor64, lhsReg, target);

	EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, cmd.rA * 8, lhsReg); // Store long to target
#else
	// Load long RHS value into EAX:EDX
	x86GenCodeLoadInt64FromPointer(ctx, rEDX, rEAX, rEDX, cmd.rC, cmd.argument);

	EMIT_OP_REG_RPTR(ctx.ctx, o_xor, rEAX, sDWORD, rREG, cmd.rB * 8);
	EMIT_OP_REG_RPTR(ctx.ctx, o_xor, rEDX, sDWORD, rREG, cmd.rB * 8 + 4);

	// Store long in EAX:EDX to target
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, rEAX);
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8 + 4, rEDX);
#endif
}